

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

uint rf_gfx_load_texture_cubemap(void *data,int size,rf_pixel_format format)

{
  _Bool _Var1;
  int iVar2;
  rf_gfx_pixel_format rVar3;
  int local_68 [2];
  int swizzle_mask_1 [4];
  int swizzle_mask [4];
  uint local_3c;
  uint uStack_38;
  uint i;
  rf_gfx_pixel_format glformat;
  uint data_size;
  uint cubemap_id;
  rf_pixel_format format_local;
  int size_local;
  void *data_local;
  
  glformat.valid = false;
  glformat._13_3_ = 0;
  iVar2 = rf_bytes_per_pixel(format);
  glformat.type = size * size * iVar2;
  (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,(uint *)&glformat.valid);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,glformat._12_4_);
  rVar3 = rf_gfx_get_internal_texture_formats(format);
  if (((undefined1  [16])rVar3 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
      _Var1 = rf_is_uncompressed_format(format);
      uStack_38 = rVar3.internal_format;
      if (_Var1) {
        i = rVar3.format;
        glformat.internal_format = rVar3.type;
        (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
                  (local_3c + 0x8515,0,uStack_38,size,size,0,i,glformat.internal_format,
                   (void *)((long)data + (ulong)(local_3c * glformat.type)));
      }
      else {
        (*(rf__ctx->field_0).gfx_ctx.gl.CompressedTexImage2D)
                  (local_3c + 0x8515,0,uStack_38,size,size,0,glformat.type,
                   (void *)((long)data + (ulong)(local_3c * glformat.type)));
      }
      if (format == RF_UNCOMPRESSED_GRAYSCALE) {
        swizzle_mask_1[2] = 0x1903;
        swizzle_mask_1[3] = 0x1903;
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0x8513,0x8e46,swizzle_mask_1 + 2);
      }
      else if (format == RF_UNCOMPRESSED_GRAY_ALPHA) {
        local_68[0] = 0x1903;
        local_68[1] = 0x1903;
        swizzle_mask_1[0] = 0x1903;
        swizzle_mask_1[1] = 0x1904;
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteriv)(0x8513,0x8e46,local_68);
      }
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2801,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2800,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2802,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2803,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x8072,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,0);
  return glformat._12_4_;
}

Assistant:

RF_API unsigned int rf_gfx_load_texture_cubemap(void* data, int size, rf_pixel_format format)
{
    unsigned int cubemap_id = 0;
    unsigned int data_size = size * size * rf_bytes_per_pixel(format);

    rf_gl.GenTextures(1, &cubemap_id);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, cubemap_id);

    rf_gfx_pixel_format glformat = rf_gfx_get_internal_texture_formats(format);

    if (glformat.valid)
    {
        // Load cubemap faces
        for (unsigned int i = 0; i < 6; i++)
        {
            if (rf_is_uncompressed_format(format)) rf_gl.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glformat.internal_format, size, size, 0, glformat.format, glformat.type, (unsigned char* )data + i * data_size);
            else rf_gl.CompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, glformat.internal_format, size, size, 0, data_size, (unsigned char* )data + i*data_size);

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                if (format == RF_UNCOMPRESSED_GRAYSCALE)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                    rf_gl.TexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
                else if (format == RF_UNCOMPRESSED_GRAY_ALPHA)
                {
                    int swizzle_mask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
                    rf_gl.TexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzle_mask);
                }
            #endif
        }
    }

    // Set cubemap texture sampling parameters
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);  // Flag not supported on OpenGL ES 2.0
    #endif // defined(RAYFORK_GRAPHICS_BACKEND_GL_33)

    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, 0);

    return cubemap_id;
}